

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O3

SortNode * __thiscall GLDrawList::DoSort(GLDrawList *this,SortNode *head)

{
  GLDrawItemType GVar1;
  SortNode *pSVar2;
  SortNode *head_00;
  SortNode *pSVar3;
  
  pSVar3 = head;
  do {
    head_00 = pSVar3;
    pSVar3 = head_00->next;
    GVar1 = (this->drawitems).Array[head_00->itemindex].rendertype;
    if (pSVar3 == (SortNode *)0x0) {
      if (GVar1 != GLDIT_FLAT) {
        head_00 = FindSortWall(this,head);
        if (head_00 == (SortNode *)0x0) {
          pSVar3 = SortSpriteList(this,head);
          return pSVar3;
        }
        if (head_00 == head) {
          head = head->next;
        }
        pSVar3 = head_00->parent;
        pSVar2 = head_00->next;
        if (pSVar3 != (SortNode *)0x0) {
          pSVar3->next = pSVar2;
        }
        if (pSVar2 != (SortNode *)0x0) {
          pSVar2->parent = pSVar3;
        }
        head_00->parent = (SortNode *)0x0;
        head_00->next = (SortNode *)0x0;
        while (pSVar3 = head, pSVar3 != (SortNode *)0x0) {
          head = pSVar3->next;
          GVar1 = (this->drawitems).Array[pSVar3->itemindex].rendertype;
          if (GVar1 == GLDIT_SPRITE) {
            SortSpriteIntoWall(this,head_00,pSVar3);
          }
          else if (GVar1 == GLDIT_WALL) {
            SortWallIntoWall(this,head_00,pSVar3);
          }
        }
        goto LAB_004651a5;
      }
      break;
    }
  } while (GVar1 != GLDIT_FLAT);
  if (head_00 == head) {
    head = head->next;
  }
  pSVar2 = head_00->parent;
  if (pSVar2 != (SortNode *)0x0) {
    pSVar2->next = pSVar3;
  }
  if (pSVar3 != (SortNode *)0x0) {
    pSVar3->parent = pSVar2;
  }
  head_00->parent = (SortNode *)0x0;
  head_00->next = (SortNode *)0x0;
  while (pSVar3 = head, pSVar3 != (SortNode *)0x0) {
    head = pSVar3->next;
    GVar1 = (this->drawitems).Array[pSVar3->itemindex].rendertype;
    if (GVar1 == GLDIT_WALL) {
      SortWallIntoPlane(this,head_00,pSVar3);
    }
    else if (GVar1 == GLDIT_SPRITE) {
      SortSpriteIntoPlane(this,head_00,pSVar3);
    }
    else if (GVar1 == GLDIT_FLAT) {
      SortPlaneIntoPlane(this,head_00,pSVar3);
    }
  }
LAB_004651a5:
  if (head_00->left != (SortNode *)0x0) {
    pSVar3 = DoSort(this,head_00->left);
    head_00->left = pSVar3;
  }
  if (head_00->right != (SortNode *)0x0) {
    pSVar3 = DoSort(this,head_00->right);
    head_00->right = pSVar3;
  }
  return head_00;
}

Assistant:

SortNode * GLDrawList::DoSort(SortNode * head)
{
	SortNode * node, * sn, * next;

	sn=FindSortPlane(head);
	if (sn)
	{
		if (sn==head) head=head->next;
		sn->UnlinkFromChain();
		node=head;
		head=sn;
		while (node)
		{
			next=node->next;
			switch(drawitems[node->itemindex].rendertype)
			{
			case GLDIT_FLAT:
				SortPlaneIntoPlane(head,node);
				break;

			case GLDIT_WALL:
				SortWallIntoPlane(head,node);
				break;

			case GLDIT_SPRITE:
				SortSpriteIntoPlane(head,node);
				break;
			}
			node=next;
		}
	}
	else
	{
		sn=FindSortWall(head);
		if (sn)
		{
			if (sn==head) head=head->next;
			sn->UnlinkFromChain();
			node=head;
			head=sn;
			while (node)
			{
				next=node->next;
				switch(drawitems[node->itemindex].rendertype)
				{
				case GLDIT_WALL:
					SortWallIntoWall(head,node);
					break;

				case GLDIT_SPRITE:
					SortSpriteIntoWall(head,node);
					break;

				case GLDIT_FLAT: break;
				}
				node=next;
			}
		}
		else 
		{
			return SortSpriteList(head);
		}
	}
	if (head->left) head->left=DoSort(head->left);
	if (head->right) head->right=DoSort(head->right);
	return sn;
}